

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_close(p_ply ply)

{
  size_t sVar1;
  p_ply in_RDI;
  p_ply_element element;
  long i;
  long local_18;
  
  if ((in_RDI->io_mode == PLY_WRITE) &&
     (sVar1 = fwrite(in_RDI->buffer,1,in_RDI->buffer_last,(FILE *)in_RDI->fp),
     sVar1 < in_RDI->buffer_last)) {
    ply_ferror(in_RDI,"Error closing up");
    return 0;
  }
  if (in_RDI->fp != (FILE *)0x0) {
    fclose((FILE *)in_RDI->fp);
  }
  if (in_RDI->gzfp != (gzFile)0x0) {
    gzclose(in_RDI->gzfp);
  }
  if (in_RDI->element != (p_ply_element)0x0) {
    for (local_18 = 0; local_18 < in_RDI->nelements; local_18 = local_18 + 1) {
      if (in_RDI->element[local_18].property != (p_ply_property_conflict)0x0) {
        free(in_RDI->element[local_18].property);
      }
    }
    free(in_RDI->element);
  }
  if (in_RDI->obj_info != (char *)0x0) {
    free(in_RDI->obj_info);
  }
  if (in_RDI->comment != (char *)0x0) {
    free(in_RDI->comment);
  }
  free(in_RDI);
  return 1;
}

Assistant:

int ply_close(p_ply ply) {
    long i;
    assert(ply && (ply->fp || ply->gzfp));
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    /* write last chunk to file */
    if (ply->io_mode == PLY_WRITE &&
        fwrite(ply->buffer, 1, ply->buffer_last, ply->fp) < ply->buffer_last) {
        ply_ferror(ply, "Error closing up");
        return 0;
    }
    if (ply->fp) fclose(ply->fp);
    if (ply->gzfp) gzclose(ply->gzfp);
    /* free all memory used by handle */
    if (ply->element) {
        for (i = 0; i < ply->nelements; i++) {
            p_ply_element element = &ply->element[i];
            if (element->property) free(element->property);
        }
        free(ply->element);
    }
    if (ply->obj_info) free(ply->obj_info);
    if (ply->comment) free(ply->comment);
    free(ply);
    return 1;
}